

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O0

void printf_btr_sja1000(can_bittiming *bt,_Bool hdr)

{
  byte in_SIL;
  long in_RDI;
  uint8_t btr1;
  uint8_t btr0;
  
  if ((in_SIL & 1) == 0) {
    printf("0x%02x 0x%02x",
           (ulong)(byte)((char)*(undefined4 *)(in_RDI + 0x1c) - 1U & 0x3f |
                        (byte)((*(int *)(in_RDI + 0x18) - 1U & 3) << 6)),
           (ulong)(byte)(((char)*(undefined4 *)(in_RDI + 0xc) + (char)*(undefined4 *)(in_RDI + 0x10)
                         ) - 1U & 0xf | (byte)((*(int *)(in_RDI + 0x14) - 1U & 7) << 4)));
  }
  else {
    printf("%9s","BTR0 BTR1");
  }
  return;
}

Assistant:

static void printf_btr_sja1000(struct can_bittiming *bt, bool hdr)
{
	uint8_t btr0, btr1;

	if (hdr) {
		printf("%9s", "BTR0 BTR1");
	} else {
		btr0 = ((bt->brp - 1) & 0x3f) | (((bt->sjw - 1) & 0x3) << 6);
		btr1 = ((bt->prop_seg + bt->phase_seg1 - 1) & 0xf) |
			(((bt->phase_seg2 - 1) & 0x7) << 4);
		printf("0x%02x 0x%02x", btr0, btr1);
	}
}